

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_Dxx_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  float fVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  bool *pbVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  float *pfVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  uint uVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  int width;
  int height;
  int local_134;
  int local_130;
  int data_width;
  
  auVar72 = in_ZMM20._0_16_;
  pfVar6 = layer->response;
  iVar1 = layer->filter_size;
  iVar2 = layer->step;
  lVar44 = (long)iVar2;
  pbVar7 = layer->laplacian;
  uVar53 = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  iVar3 = iimage->data_width;
  pfVar8 = iimage->data;
  uVar11 = iVar1 / 3;
  iVar22 = layer->height;
  uVar12 = iVar1 / 6;
  iVar4 = layer->width;
  fVar73 = 1.0 / (float)(iVar1 * iVar1);
  iVar5 = iimage->width;
  if (2 < iVar1) {
    iVar56 = uVar12 + iVar2;
    uVar45 = ~uVar12;
    iVar42 = iVar56 - iVar56 % iVar2;
    iVar28 = -(iVar56 % iVar2);
    iVar13 = -uVar11;
    iVar61 = uVar11 - 1;
    iVar48 = iVar3 * iVar61;
    iVar67 = iVar2 * iVar3;
    iVar14 = iVar56 + uVar11 + uVar45 + iVar48;
    iVar62 = uVar45 + uVar11 + iVar48;
    iVar29 = uVar45 + iVar56 + iVar48;
    iVar15 = iVar56 + iVar48 + uVar53;
    iVar40 = iimage->height;
    iVar16 = uVar53 + iVar48;
    iVar52 = 0;
    do {
      iVar66 = iVar52 + 1 + uVar11;
      iVar30 = iVar52 - uVar53;
      iVar57 = (iVar52 / iVar2) * iVar4;
      iVar60 = iVar30;
      if (iVar40 < iVar30) {
        iVar60 = iVar40;
      }
      iVar17 = iVar1 + iVar30;
      iVar39 = iVar40;
      if (iVar17 < iVar40) {
        iVar39 = iVar17;
      }
      iVar31 = (iVar39 + -1) * iVar3;
      iVar54 = (iVar60 + -1) * iVar3;
      iVar32 = iVar52 - uVar12;
      iVar33 = iVar32 + uVar11;
      iVar20 = iVar32;
      if (iVar40 < iVar32) {
        iVar20 = iVar40;
      }
      iVar21 = iVar40;
      if (iVar33 < iVar40) {
        iVar21 = iVar33;
      }
      iVar55 = (iVar20 + -1) * iVar3;
      iVar34 = (iVar21 + -1) * iVar3;
      iVar35 = iVar52 - uVar11;
      iVar50 = iVar35;
      if (iVar40 < iVar35) {
        iVar50 = iVar40;
      }
      iVar51 = iVar40;
      if (iVar52 < iVar40) {
        iVar51 = iVar52;
      }
      iVar36 = (iVar50 + -1) * iVar3;
      iVar37 = (iVar51 + -1) * iVar3;
      iVar38 = iVar52 + 1;
      iVar59 = iVar38;
      if (iVar40 < iVar38) {
        iVar59 = iVar40;
      }
      if (iVar40 <= iVar66) {
        iVar66 = iVar40;
      }
      lVar46 = (long)iVar57;
      lVar65 = 0;
      iVar23 = (iVar59 + -1) * iVar3;
      iVar24 = (iVar66 + -1) * iVar3;
      do {
        iVar57 = iVar57 + 1;
        fVar75 = 0.0;
        fVar78 = 0.0;
        iVar19 = (int)lVar65;
        auVar74 = SUB6416(ZEXT464(0xc0400000),0);
        auVar72 = vfmadd213ss_fma(ZEXT416((uint)pfVar8[iVar62 + iVar19]),auVar74,
                                  ZEXT416((uint)pfVar8[iVar16 + iVar19]));
        iVar58 = iVar13 + 1 + iVar19;
        if (iVar5 < iVar58) {
          iVar58 = iVar5;
        }
        iVar49 = iVar58 + -1;
        iVar25 = uVar11 + iVar19;
        if (iVar5 <= (int)(uVar11 + iVar19)) {
          iVar25 = iVar5;
        }
        if ((0 < iVar60) && (0 < iVar58)) {
          fVar78 = pfVar8[iVar54 + iVar49];
        }
        iVar18 = iVar25 + -1;
        if ((0 < iVar60) && (0 < iVar25)) {
          fVar75 = pfVar8[iVar54 + iVar18];
        }
        fVar77 = 0.0;
        fVar79 = 0.0;
        if ((0 < iVar39) && (0 < iVar58)) {
          fVar79 = pfVar8[iVar31 + iVar49];
        }
        if ((0 < iVar39) && (0 < iVar25)) {
          fVar77 = pfVar8[iVar31 + iVar18];
        }
        fVar80 = 0.0;
        if ((0 < iVar20) && (0 < iVar58)) {
          fVar80 = pfVar8[iVar55 + iVar49];
        }
        fVar81 = 0.0;
        if ((0 < iVar20) && (0 < iVar25)) {
          fVar81 = pfVar8[iVar55 + iVar18];
        }
        fVar82 = 0.0;
        fVar83 = 0.0;
        if ((0 < iVar21) && (0 < iVar58)) {
          fVar83 = pfVar8[iVar49 + iVar34];
        }
        if ((0 < iVar21) && (0 < iVar25)) {
          fVar82 = pfVar8[iVar18 + iVar34];
        }
        iVar25 = iVar19 + 1 + uVar11;
        fVar76 = 0.0;
        iVar58 = iVar19 + 1;
        if (iVar5 < iVar19 + 1) {
          iVar58 = iVar5;
        }
        if (iVar5 <= iVar25) {
          iVar25 = iVar5;
        }
        iVar49 = iVar58 + -1;
        auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),
                            ZEXT816(0) << 0x40);
        auVar68 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                             ZEXT816(0) << 0x40);
        auVar9 = vfmadd132ss_fma(auVar68,auVar9,auVar74);
        fVar78 = 0.0;
        if ((0 < iVar50) && (0 < iVar58)) {
          fVar78 = pfVar8[iVar36 + iVar49];
        }
        iVar18 = iVar25 + -1;
        if ((0 < iVar50) && (0 < iVar25)) {
          fVar76 = pfVar8[iVar36 + iVar18];
        }
        fVar79 = 0.0;
        fVar75 = 0.0;
        if ((0 < iVar51) && (0 < iVar58)) {
          fVar75 = pfVar8[iVar37 + iVar49];
        }
        if ((0 < iVar51) && (0 < iVar25)) {
          fVar79 = pfVar8[iVar37 + iVar18];
        }
        fVar77 = 0.0;
        iVar26 = iVar13 + iVar19;
        if (iVar5 < iVar13 + iVar19) {
          iVar26 = iVar5;
        }
        iVar43 = iVar26 + -1;
        iVar63 = iVar5;
        if (iVar19 < iVar5) {
          iVar63 = iVar19;
        }
        if ((0 < iVar59) && (0 < iVar26)) {
          fVar77 = pfVar8[iVar23 + iVar43];
        }
        iVar19 = iVar63 + -1;
        fVar80 = 0.0;
        if ((0 < iVar59) && (0 < iVar63)) {
          fVar80 = pfVar8[iVar23 + iVar19];
        }
        fVar83 = 0.0;
        fVar81 = 0.0;
        if ((0 < iVar66) && (0 < iVar26)) {
          fVar81 = pfVar8[iVar24 + iVar43];
        }
        if ((0 < iVar66) && (0 < iVar63)) {
          fVar83 = pfVar8[iVar24 + iVar19];
        }
        auVar71 = ZEXT816(0) << 0x40;
        auVar68 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        in_ZMM16 = ZEXT1664(auVar68);
        if ((0 < iVar50) && (0 < iVar26)) {
          in_ZMM16 = ZEXT464((uint)pfVar8[iVar36 + iVar43]);
        }
        auVar68 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        in_ZMM17 = ZEXT1664(auVar68);
        if ((0 < iVar50) && (0 < iVar63)) {
          in_ZMM17 = ZEXT464((uint)pfVar8[iVar36 + iVar19]);
        }
        auVar68 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        in_ZMM18 = ZEXT1664(auVar68);
        auVar68 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar68);
        if ((0 < iVar51) && (0 < iVar26)) {
          in_ZMM19 = ZEXT464((uint)pfVar8[iVar43 + iVar37]);
        }
        if (0 < iVar51 && 0 < iVar63) {
          in_ZMM18 = ZEXT464((uint)pfVar8[iVar19 + iVar37]);
        }
        auVar68 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        in_ZMM20 = ZEXT1664(auVar68);
        auVar69 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        in_ZMM21 = ZEXT1664(auVar69);
        if ((0 < iVar59) && (0 < iVar58)) {
          in_ZMM21 = ZEXT464((uint)pfVar8[iVar23 + iVar49]);
        }
        auVar69 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar69);
        if ((0 < iVar59) && (0 < iVar25)) {
          in_ZMM22 = ZEXT464((uint)pfVar8[iVar23 + iVar18]);
        }
        auVar69 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        in_ZMM23 = ZEXT1664(auVar69);
        auVar69 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        in_ZMM24 = ZEXT1664(auVar69);
        if ((0 < iVar66) && (0 < iVar58)) {
          in_ZMM24 = ZEXT464((uint)pfVar8[iVar49 + iVar24]);
        }
        if ((0 < iVar66) && (0 < iVar25)) {
          in_ZMM23 = ZEXT464((uint)pfVar8[iVar18 + iVar24]);
        }
        fVar82 = fVar73 * auVar72._0_4_;
        fVar10 = fVar73 * auVar9._0_4_;
        auVar72 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar76) - fVar75))),
                             ZEXT816(0) << 0x40);
        auVar9 = vmaxss_avx(ZEXT416((uint)(fVar83 + ((fVar77 - fVar80) - fVar81))),auVar71);
        auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
        auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
        auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
        auVar69 = vmaxss_avx512f(auVar69,auVar68);
        auVar68 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
        auVar68 = vsubss_avx512f(auVar68,in_ZMM24._0_16_);
        auVar68 = vaddss_avx512f(auVar68,in_ZMM23._0_16_);
        auVar68 = vmaxss_avx(auVar68,ZEXT816(0) << 0x40);
        fVar78 = fVar73 * (((auVar72._0_4_ + auVar9._0_4_) - auVar69._0_4_) - auVar68._0_4_);
        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),ZEXT416((uint)fVar82),
                                  ZEXT416((uint)fVar10));
        pfVar6[lVar46] = auVar72._0_4_;
        pbVar7[lVar46] = 0.0 <= fVar82 + fVar10;
        lVar46 = lVar46 + 1;
        lVar65 = lVar65 + lVar44;
      } while (lVar65 <= (long)(ulong)uVar12);
      if (iVar42 <= (int)uVar53) {
        iVar60 = iimage->height;
        if (iVar60 < iVar30) {
          iVar30 = iVar60;
        }
        if (iVar60 <= iVar17) {
          iVar17 = iVar60;
        }
        iVar39 = (iVar30 + -1) * iVar3;
        iVar66 = (iVar17 + -1) * iVar3;
        if (iVar60 < iVar32) {
          iVar32 = iVar60;
        }
        if (iVar60 <= iVar33) {
          iVar33 = iVar60;
        }
        iVar31 = (iVar32 + -1) * iVar3;
        iVar20 = (iVar33 + -1) * iVar3;
        if (iVar60 < iVar35) {
          iVar35 = iVar60;
        }
        iVar54 = iVar60;
        if (iVar52 < iVar60) {
          iVar54 = iVar52;
        }
        iVar21 = (iVar35 + -1) * iVar3;
        iVar50 = (iVar54 + -1) * iVar3;
        if (iVar60 < iVar38) {
          iVar38 = iVar60;
        }
        iVar34 = iVar52 + 1 + uVar11;
        if (iVar34 < iVar60) {
          iVar60 = iVar34;
        }
        iVar23 = (iVar38 + -1) * iVar3;
        iVar37 = (iVar60 + -1) * iVar3;
        pfVar41 = pfVar6 + iVar57;
        pbVar27 = pbVar7 + iVar57;
        lVar46 = (long)iVar42;
        iVar55 = iVar56 - uVar11;
        iVar57 = iVar29;
        iVar51 = iVar56;
        iVar59 = iVar56 + uVar11;
        iVar36 = iVar15;
        iVar34 = iVar14;
        do {
          fVar75 = 0.0;
          fVar78 = 0.0;
          iVar24 = iVar28 + 1 + iVar55;
          if (iVar5 < iVar24) {
            iVar24 = iVar5;
          }
          iVar19 = iVar28 + iVar59;
          if (iVar5 <= iVar28 + iVar59) {
            iVar19 = iVar5;
          }
          iVar58 = iVar24 + -1;
          if ((0 < iVar30) && (0 < iVar24)) {
            fVar78 = pfVar8[iVar39 + iVar58];
          }
          iVar25 = iVar19 + -1;
          if ((0 < iVar30) && (0 < iVar19)) {
            fVar75 = pfVar8[iVar39 + iVar25];
          }
          fVar77 = 0.0;
          fVar79 = 0.0;
          if ((0 < iVar17) && (0 < iVar24)) {
            fVar79 = pfVar8[iVar66 + iVar58];
          }
          if ((0 < iVar17) && (0 < iVar19)) {
            fVar77 = pfVar8[iVar66 + iVar25];
          }
          fVar80 = 0.0;
          if ((0 < iVar32) && (0 < iVar24)) {
            fVar80 = pfVar8[iVar31 + iVar58];
          }
          fVar81 = 0.0;
          if ((0 < iVar32) && (0 < iVar19)) {
            fVar81 = pfVar8[iVar31 + iVar25];
          }
          fVar82 = 0.0;
          fVar83 = 0.0;
          auVar72 = vfmadd213ss_fma(ZEXT416((uint)(pfVar8[iVar28 + iVar34] - pfVar8[iVar28 + iVar57]
                                                  )),auVar74,ZEXT416((uint)pfVar8[iVar28 + iVar36]))
          ;
          if ((0 < iVar33) && (0 < iVar24)) {
            fVar83 = pfVar8[iVar58 + iVar20];
          }
          if ((0 < iVar33) && (0 < iVar19)) {
            fVar82 = pfVar8[iVar25 + iVar20];
          }
          fVar76 = 0.0;
          iVar24 = iVar28 + 1 + iVar51;
          iVar19 = iVar28 + 1 + iVar59;
          if (iVar5 < iVar24) {
            iVar24 = iVar5;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),
                              ZEXT816(0) << 0x40);
          if (iVar5 <= iVar19) {
            iVar19 = iVar5;
          }
          iVar58 = iVar24 + -1;
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar68,auVar9,auVar74);
          fVar78 = 0.0;
          if ((0 < iVar35) && (0 < iVar24)) {
            fVar78 = pfVar8[iVar21 + iVar58];
          }
          iVar25 = iVar19 + -1;
          if ((0 < iVar35) && (0 < iVar19)) {
            fVar76 = pfVar8[iVar21 + iVar25];
          }
          fVar79 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar54) && (0 < iVar24)) {
            fVar75 = pfVar8[iVar50 + iVar58];
          }
          if ((0 < iVar54) && (0 < iVar19)) {
            fVar79 = pfVar8[iVar50 + iVar25];
          }
          fVar77 = 0.0;
          iVar49 = iVar28 + iVar55;
          if (iVar5 < iVar28 + iVar55) {
            iVar49 = iVar5;
          }
          iVar26 = iVar49 + -1;
          iVar18 = iVar28 + iVar51;
          if (iVar5 <= iVar28 + iVar51) {
            iVar18 = iVar5;
          }
          if ((0 < iVar38) && (0 < iVar49)) {
            fVar77 = pfVar8[iVar23 + iVar26];
          }
          iVar63 = iVar18 + -1;
          fVar80 = 0.0;
          if ((0 < iVar38) && (0 < iVar18)) {
            fVar80 = pfVar8[iVar23 + iVar63];
          }
          fVar83 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar60) && (0 < iVar49)) {
            fVar81 = pfVar8[iVar37 + iVar26];
          }
          if ((0 < iVar60) && (0 < iVar18)) {
            fVar83 = pfVar8[iVar37 + iVar63];
          }
          auVar71 = ZEXT816(0) << 0x40;
          auVar68 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar68);
          if ((0 < iVar35) && (0 < iVar49)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar21 + iVar26]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar68);
          if ((0 < iVar35) && (0 < iVar18)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar21 + iVar63]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar68);
          if ((0 < iVar54) && (0 < iVar49)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar26 + iVar50]);
          }
          if ((0 < iVar54) && (0 < iVar18)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar63 + iVar50]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          in_ZMM20 = ZEXT1664(auVar68);
          auVar69 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar69);
          if ((0 < iVar38) && (0 < iVar24)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar23 + iVar58]);
          }
          auVar69 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar69);
          if ((0 < iVar38) && (0 < iVar19)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar23 + iVar25]);
          }
          auVar69 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar69);
          auVar69 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar69);
          if ((0 < iVar60) && (0 < iVar24)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar58 + iVar37]);
          }
          if ((0 < iVar60) && (0 < iVar19)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar25 + iVar37]);
          }
          fVar82 = fVar73 * auVar72._0_4_;
          fVar10 = fVar73 * auVar9._0_4_;
          auVar72 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar76) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar83 + ((fVar77 - fVar80) - fVar81))),auVar71);
          auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
          auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
          auVar69 = vmaxss_avx512f(auVar69,auVar68);
          auVar68 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar68 = vsubss_avx512f(auVar68,in_ZMM24._0_16_);
          auVar68 = vaddss_avx512f(auVar68,in_ZMM23._0_16_);
          auVar68 = vmaxss_avx(auVar68,ZEXT816(0) << 0x40);
          fVar78 = fVar73 * (((auVar72._0_4_ + auVar9._0_4_) - auVar69._0_4_) - auVar68._0_4_);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),ZEXT416((uint)fVar82),
                                    ZEXT416((uint)fVar10));
          *pfVar41 = auVar72._0_4_;
          *pbVar27 = 0.0 <= fVar82 + fVar10;
          iVar34 = iVar34 + iVar2;
          lVar46 = lVar46 + lVar44;
          pfVar41 = pfVar41 + 1;
          pbVar27 = pbVar27 + 1;
          iVar59 = iVar59 + iVar2;
          iVar51 = iVar51 + iVar2;
          iVar55 = iVar55 + iVar2;
          iVar57 = iVar57 + iVar2;
          iVar36 = iVar36 + iVar2;
        } while (lVar46 <= (int)uVar53);
      }
      auVar72 = in_ZMM20._0_16_;
      iVar62 = iVar62 + iVar67;
      iVar14 = iVar14 + iVar67;
      iVar29 = iVar29 + iVar67;
      iVar52 = iVar52 + iVar2;
      iVar16 = iVar16 + iVar67;
      iVar15 = iVar15 + iVar67;
    } while (iVar52 < (int)uVar11);
    iVar14 = (int)(uVar53 + iVar2) / iVar2;
    if (2 < iVar1) {
      iVar52 = iVar14 * iVar2;
      iVar16 = 0;
      iVar28 = iVar4 * iVar2;
      local_130 = iVar48 + -1;
      iVar62 = iVar48 + uVar53;
      iVar29 = uVar45 + uVar11 + iVar48;
      iVar42 = iVar2 * iVar3;
      iVar40 = local_130 - uVar12;
      iVar15 = local_130 - uVar53;
      do {
        if (iVar52 < (int)(iVar28 - uVar53)) {
          iVar66 = iVar16 - uVar53;
          iVar60 = (iVar16 / iVar2) * iVar4 + iVar14;
          iVar56 = iimage->height;
          iVar67 = iVar66;
          if (iVar56 < iVar66) {
            iVar67 = iVar56;
          }
          iVar57 = iVar66 + iVar1;
          if (iVar56 <= iVar66 + iVar1) {
            iVar57 = iVar56;
          }
          iVar30 = (iVar67 + -1) * iVar3;
          iVar17 = (iVar57 + -1) * iVar3;
          iVar39 = iVar16 - uVar12;
          iVar66 = iVar39;
          if (iVar56 < iVar39) {
            iVar66 = iVar56;
          }
          iVar20 = iVar39 + uVar11;
          if (iVar56 <= (int)(iVar39 + uVar11)) {
            iVar20 = iVar56;
          }
          iVar33 = (iVar66 + -1) * iVar3;
          iVar32 = (iVar20 + -1) * iVar3;
          iVar39 = iVar16 - uVar11;
          if (iVar56 < (int)(iVar16 - uVar11)) {
            iVar39 = iVar56;
          }
          iVar31 = iVar56;
          if (iVar16 < iVar56) {
            iVar31 = iVar16;
          }
          iVar21 = (iVar39 + -1) * iVar3;
          iVar35 = (iVar31 + -1) * iVar3;
          iVar50 = iVar16 + 1 + uVar11;
          iVar54 = iVar16 + 1;
          if (iVar56 < iVar16 + 1) {
            iVar54 = iVar56;
          }
          if (iVar50 < iVar56) {
            iVar56 = iVar50;
          }
          iVar59 = (iVar54 + -1) * iVar3;
          iVar38 = (iVar56 + -1) * iVar3;
          pfVar41 = pfVar6 + iVar60;
          pbVar27 = pbVar7 + iVar60;
          iVar36 = 0;
          lVar46 = (long)iVar52;
          iVar60 = iVar40;
          iVar50 = iVar15;
          iVar34 = iVar62;
          iVar55 = iVar29;
          uVar64 = uVar11;
          iVar51 = iVar13;
          do {
            fVar78 = 0.0;
            iVar37 = iVar52 + 1 + iVar51;
            if (iVar5 < iVar37) {
              iVar37 = iVar5;
            }
            iVar24 = iVar37 + -1;
            iVar23 = iVar52 + uVar64;
            if (iVar5 <= (int)(iVar52 + uVar64)) {
              iVar23 = iVar5;
            }
            auVar9 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar52 + iVar55] -
                                                   pfVar8[iVar60 + iVar52])),
                                     ZEXT416((uint)(pfVar8[iVar52 + iVar34] -
                                                   pfVar8[iVar52 + iVar50])),auVar74);
            fVar75 = 0.0;
            if ((0 < iVar67) && (0 < iVar37)) {
              fVar78 = pfVar8[iVar30 + iVar24];
            }
            iVar19 = iVar23 + -1;
            if ((0 < iVar67) && (0 < iVar23)) {
              fVar75 = pfVar8[iVar30 + iVar19];
            }
            fVar77 = 0.0;
            fVar79 = 0.0;
            if ((0 < iVar57) && (0 < iVar37)) {
              fVar79 = pfVar8[iVar17 + iVar24];
            }
            if ((0 < iVar57) && (0 < iVar23)) {
              fVar77 = pfVar8[iVar17 + iVar19];
            }
            fVar80 = 0.0;
            if ((0 < iVar66) && (0 < iVar37)) {
              fVar80 = pfVar8[iVar33 + iVar24];
            }
            fVar81 = 0.0;
            if ((0 < iVar66) && (0 < iVar23)) {
              fVar81 = pfVar8[iVar33 + iVar19];
            }
            fVar82 = 0.0;
            fVar83 = 0.0;
            if ((0 < iVar20) && (0 < iVar37)) {
              fVar83 = pfVar8[iVar24 + iVar32];
            }
            if ((0 < iVar20) && (0 < iVar23)) {
              fVar82 = pfVar8[iVar19 + iVar32];
            }
            iVar37 = iVar52 + 1 + iVar36;
            iVar23 = iVar52 + 1 + uVar64;
            fVar76 = 0.0;
            if (iVar5 < iVar37) {
              iVar37 = iVar5;
            }
            if (iVar5 <= iVar23) {
              iVar23 = iVar5;
            }
            iVar24 = iVar37 + -1;
            auVar68 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),
                                 ZEXT816(0) << 0x40);
            auVar69 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                                 ZEXT816(0) << 0x40);
            auVar68 = vfmadd132ss_fma(auVar69,auVar68,auVar74);
            fVar78 = 0.0;
            if ((0 < iVar39) && (0 < iVar37)) {
              fVar78 = pfVar8[iVar21 + iVar24];
            }
            iVar19 = iVar23 + -1;
            if ((0 < iVar39) && (0 < iVar23)) {
              fVar76 = pfVar8[iVar21 + iVar19];
            }
            fVar79 = 0.0;
            fVar75 = 0.0;
            if ((0 < iVar31) && (0 < iVar37)) {
              fVar75 = pfVar8[iVar35 + iVar24];
            }
            if ((0 < iVar31) && (0 < iVar23)) {
              fVar79 = pfVar8[iVar35 + iVar19];
            }
            fVar77 = 0.0;
            iVar58 = iVar52 + iVar51;
            if (iVar5 < iVar52 + iVar51) {
              iVar58 = iVar5;
            }
            iVar25 = iVar52 + iVar36;
            if (iVar5 <= iVar52 + iVar36) {
              iVar25 = iVar5;
            }
            iVar49 = iVar58 + -1;
            if ((0 < iVar54) && (0 < iVar58)) {
              fVar77 = pfVar8[iVar59 + iVar49];
            }
            iVar18 = iVar25 + -1;
            fVar80 = 0.0;
            if ((0 < iVar54) && (0 < iVar25)) {
              fVar80 = pfVar8[iVar59 + iVar18];
            }
            fVar83 = 0.0;
            fVar81 = 0.0;
            if ((0 < iVar56) && (0 < iVar58)) {
              fVar81 = pfVar8[iVar38 + iVar49];
            }
            if ((0 < iVar56) && (0 < iVar25)) {
              fVar83 = pfVar8[iVar38 + iVar18];
            }
            auVar69 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            in_ZMM16 = ZEXT1664(auVar69);
            if ((0 < iVar39) && (0 < iVar58)) {
              in_ZMM16 = ZEXT464((uint)pfVar8[iVar21 + iVar49]);
            }
            auVar69 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
            in_ZMM17 = ZEXT1664(auVar69);
            if ((0 < iVar39) && (0 < iVar25)) {
              in_ZMM17 = ZEXT464((uint)pfVar8[iVar21 + iVar18]);
            }
            auVar69 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
            in_ZMM18 = ZEXT1664(auVar69);
            auVar69 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
            in_ZMM19 = ZEXT1664(auVar69);
            if ((0 < iVar31) && (0 < iVar58)) {
              in_ZMM19 = ZEXT464((uint)pfVar8[iVar49 + iVar35]);
            }
            if ((0 < iVar31) && (0 < iVar25)) {
              in_ZMM18 = ZEXT464((uint)pfVar8[iVar18 + iVar35]);
            }
            auVar69 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
            in_ZMM21 = ZEXT1664(auVar69);
            if ((0 < iVar54) && (0 < iVar37)) {
              in_ZMM21 = ZEXT464((uint)pfVar8[iVar59 + iVar24]);
            }
            auVar69 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
            in_ZMM22 = ZEXT1664(auVar69);
            if ((0 < iVar54) && (0 < iVar23)) {
              in_ZMM22 = ZEXT464((uint)pfVar8[iVar59 + iVar19]);
            }
            auVar69 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
            in_ZMM23 = ZEXT1664(auVar69);
            auVar69 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
            in_ZMM24 = ZEXT1664(auVar69);
            if ((0 < iVar56) && (0 < iVar37)) {
              in_ZMM24 = ZEXT464((uint)pfVar8[iVar24 + iVar38]);
            }
            if ((0 < iVar56) && (0 < iVar23)) {
              in_ZMM23 = ZEXT464((uint)pfVar8[iVar19 + iVar38]);
            }
            fVar82 = fVar73 * auVar9._0_4_;
            fVar10 = fVar73 * auVar68._0_4_;
            auVar9 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar76) - fVar75))),
                                ZEXT816(0) << 0x40);
            auVar68 = vmaxss_avx(ZEXT416((uint)(fVar83 + ((fVar77 - fVar80) - fVar81))),auVar71);
            auVar69 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
            auVar69 = vsubss_avx512f(auVar69,in_ZMM19._0_16_);
            auVar69 = vaddss_avx512f(auVar69,in_ZMM18._0_16_);
            auVar70 = vmaxss_avx512f(auVar69,auVar72);
            auVar69 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
            auVar69 = vsubss_avx512f(auVar69,in_ZMM24._0_16_);
            auVar69 = vaddss_avx512f(auVar69,in_ZMM23._0_16_);
            auVar69 = vmaxss_avx(auVar69,ZEXT416(0) << 0x40);
            fVar78 = fVar73 * (((auVar9._0_4_ + auVar68._0_4_) - auVar70._0_4_) - auVar69._0_4_);
            auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),ZEXT416((uint)fVar82),
                                     ZEXT416((uint)fVar10));
            *pfVar41 = auVar9._0_4_;
            *pbVar27 = 0.0 <= fVar82 + fVar10;
            lVar46 = lVar46 + lVar44;
            pfVar41 = pfVar41 + 1;
            pbVar27 = pbVar27 + 1;
            uVar64 = uVar64 + iVar2;
            iVar36 = iVar36 + iVar2;
            iVar51 = iVar51 + iVar2;
            iVar55 = iVar55 + iVar2;
            iVar60 = iVar60 + iVar2;
            iVar34 = iVar34 + iVar2;
            iVar50 = iVar50 + iVar2;
          } while (lVar46 < (int)(iVar28 - uVar53));
        }
        iVar29 = iVar29 + iVar42;
        iVar40 = iVar40 + iVar42;
        iVar62 = iVar62 + iVar42;
        iVar15 = iVar15 + iVar42;
        iVar16 = iVar16 + iVar2;
      } while (iVar16 < (int)uVar11);
      iVar14 = (int)(~uVar53 + iVar2 + iVar28) / iVar2;
      if (2 < iVar1) {
        iVar52 = iVar28 - uVar12;
        iVar29 = iVar52 + iVar2 + -1;
        iVar42 = iVar29 % iVar2;
        iVar15 = iVar14 * iVar2;
        iVar29 = iVar29 - iVar42;
        iVar16 = -uVar11;
        iVar40 = uVar45 + uVar11 + iVar48;
        iVar13 = iVar2 * iVar3;
        local_134 = local_130 - uVar53;
        local_130 = local_130 - uVar12;
        iVar62 = iVar48 - uVar12;
        iVar48 = iVar48 - uVar53;
        uVar47 = 0;
        do {
          iVar56 = (int)uVar47;
          iVar67 = (int)((long)((ulong)(uint)(iVar56 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) /
                        (long)iVar2) * iVar4 + iVar14;
          if (iVar15 < iVar52) {
            iVar57 = iVar56 - uVar53;
            iVar60 = iimage->height;
            iVar66 = iVar57;
            if (iVar60 < iVar57) {
              iVar66 = iVar60;
            }
            iVar30 = iVar57 + iVar1;
            if (iVar60 <= iVar57 + iVar1) {
              iVar30 = iVar60;
            }
            iVar39 = (iVar66 + -1) * iVar3;
            iVar17 = (iVar30 + -1) * iVar3;
            iVar20 = iVar56 - uVar12;
            iVar57 = iVar20;
            if (iVar60 < iVar20) {
              iVar57 = iVar60;
            }
            iVar32 = iVar20 + uVar11;
            if (iVar60 <= (int)(iVar20 + uVar11)) {
              iVar32 = iVar60;
            }
            iVar33 = (iVar57 + -1) * iVar3;
            iVar31 = (iVar32 + -1) * iVar3;
            iVar20 = iVar56 - uVar11;
            if (iVar60 < (int)(iVar56 - uVar11)) {
              iVar20 = iVar60;
            }
            iVar54 = iVar60;
            if (iVar56 < iVar60) {
              iVar54 = iVar56;
            }
            iVar50 = (iVar20 + -1) * iVar3;
            iVar34 = (iVar54 + -1) * iVar3;
            iVar35 = uVar11 + 1 + iVar56;
            iVar21 = iVar56 + 1;
            if (iVar60 < iVar56 + 1) {
              iVar21 = iVar60;
            }
            if (iVar35 < iVar60) {
              iVar60 = iVar35;
            }
            iVar37 = 0;
            iVar38 = (iVar21 + -1) * iVar3;
            iVar36 = (iVar60 + -1) * iVar3;
            pfVar41 = pfVar6 + iVar67;
            pbVar27 = pbVar7 + iVar67;
            lVar46 = (long)iVar15;
            iVar35 = local_134;
            iVar55 = local_130;
            uVar45 = uVar11;
            iVar51 = iVar16;
            iVar59 = iVar40;
            do {
              fVar78 = 0.0;
              iVar23 = iVar15 + 1 + iVar51;
              if (iVar5 < iVar23) {
                iVar23 = iVar5;
              }
              iVar19 = iVar23 + -1;
              iVar24 = iVar15 + uVar45;
              if (iVar5 <= (int)(iVar15 + uVar45)) {
                iVar24 = iVar5;
              }
              auVar72 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar15 + iVar59] -
                                                      pfVar8[iVar15 + iVar55])),
                                        ZEXT416((uint)(pfVar8[(long)((iVar61 + iVar56) * iVar3 +
                                                                    iVar5) + -1] -
                                                      pfVar8[iVar15 + iVar35])),auVar74);
              fVar75 = 0.0;
              if ((0 < iVar66) && (0 < iVar23)) {
                fVar78 = pfVar8[iVar39 + iVar19];
              }
              iVar58 = iVar24 + -1;
              if ((0 < iVar66) && (0 < iVar24)) {
                fVar75 = pfVar8[iVar39 + iVar58];
              }
              fVar77 = 0.0;
              fVar79 = 0.0;
              if ((0 < iVar30) && (0 < iVar23)) {
                fVar79 = pfVar8[iVar17 + iVar19];
              }
              if ((0 < iVar30) && (0 < iVar24)) {
                fVar77 = pfVar8[iVar17 + iVar58];
              }
              fVar80 = 0.0;
              if ((0 < iVar57) && (0 < iVar23)) {
                fVar80 = pfVar8[iVar33 + iVar19];
              }
              fVar81 = 0.0;
              if ((0 < iVar57) && (0 < iVar24)) {
                fVar81 = pfVar8[iVar33 + iVar58];
              }
              fVar82 = 0.0;
              fVar83 = 0.0;
              if ((0 < iVar32) && (0 < iVar23)) {
                fVar83 = pfVar8[iVar19 + iVar31];
              }
              if ((0 < iVar32) && (0 < iVar24)) {
                fVar82 = pfVar8[iVar58 + iVar31];
              }
              fVar76 = 0.0;
              iVar23 = iVar15 + 1 + iVar37;
              iVar24 = iVar15 + 1 + uVar45;
              if (iVar5 < iVar23) {
                iVar23 = iVar5;
              }
              auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),
                                  ZEXT816(0) << 0x40);
              if (iVar5 <= iVar24) {
                iVar24 = iVar5;
              }
              iVar19 = iVar23 + -1;
              auVar68 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                                   ZEXT816(0) << 0x40);
              auVar9 = vfmadd132ss_fma(auVar68,auVar9,auVar74);
              fVar78 = 0.0;
              if ((0 < iVar20) && (0 < iVar23)) {
                fVar78 = pfVar8[iVar50 + iVar19];
              }
              iVar58 = iVar24 + -1;
              if ((0 < iVar20) && (0 < iVar24)) {
                fVar76 = pfVar8[iVar50 + iVar58];
              }
              fVar79 = 0.0;
              fVar75 = 0.0;
              if ((0 < iVar54) && (0 < iVar23)) {
                fVar75 = pfVar8[iVar34 + iVar19];
              }
              if ((0 < iVar54) && (0 < iVar24)) {
                fVar79 = pfVar8[iVar34 + iVar58];
              }
              fVar77 = 0.0;
              iVar25 = iVar15 + iVar51;
              if (iVar5 < iVar15 + iVar51) {
                iVar25 = iVar5;
              }
              iVar49 = iVar15 + iVar37;
              if (iVar5 <= iVar15 + iVar37) {
                iVar49 = iVar5;
              }
              iVar18 = iVar25 + -1;
              if ((0 < iVar21) && (0 < iVar25)) {
                fVar77 = pfVar8[iVar38 + iVar18];
              }
              iVar26 = iVar49 + -1;
              fVar80 = 0.0;
              if ((0 < iVar21) && (0 < iVar49)) {
                fVar80 = pfVar8[iVar38 + iVar26];
              }
              fVar83 = 0.0;
              fVar81 = 0.0;
              if ((0 < iVar60) && (0 < iVar25)) {
                fVar81 = pfVar8[iVar36 + iVar18];
              }
              if ((0 < iVar60) && (0 < iVar49)) {
                fVar83 = pfVar8[iVar36 + iVar26];
              }
              auVar68 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar68);
              if ((0 < iVar20) && (0 < iVar25)) {
                in_ZMM16 = ZEXT464((uint)pfVar8[iVar50 + iVar18]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar68);
              if ((0 < iVar20) && (0 < iVar49)) {
                in_ZMM17 = ZEXT464((uint)pfVar8[iVar50 + iVar26]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar68);
              auVar68 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar68);
              if ((0 < iVar54) && (0 < iVar25)) {
                in_ZMM19 = ZEXT464((uint)pfVar8[iVar18 + iVar34]);
              }
              if ((0 < iVar54) && (0 < iVar49)) {
                in_ZMM18 = ZEXT464((uint)pfVar8[iVar26 + iVar34]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar68);
              auVar71 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar71);
              if ((0 < iVar21) && (0 < iVar23)) {
                in_ZMM21 = ZEXT464((uint)pfVar8[iVar38 + iVar19]);
              }
              auVar71 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar71);
              if ((0 < iVar21) && (0 < iVar24)) {
                in_ZMM22 = ZEXT464((uint)pfVar8[iVar38 + iVar58]);
              }
              auVar71 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar71);
              auVar71 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar71);
              if ((0 < iVar60) && (0 < iVar23)) {
                in_ZMM24 = ZEXT464((uint)pfVar8[iVar19 + iVar36]);
              }
              if ((0 < iVar60) && (0 < iVar24)) {
                in_ZMM23 = ZEXT464((uint)pfVar8[iVar58 + iVar36]);
              }
              fVar82 = fVar73 * auVar72._0_4_;
              fVar10 = fVar73 * auVar9._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar76) - fVar75))),
                                   ZEXT816(0) << 0x40);
              auVar9 = vmaxss_avx(ZEXT416((uint)(fVar83 + ((fVar77 - fVar80) - fVar81))),
                                  ZEXT816(0) << 0x40);
              auVar71 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
              auVar71 = vsubss_avx512f(auVar71,in_ZMM19._0_16_);
              auVar71 = vaddss_avx512f(auVar71,in_ZMM18._0_16_);
              auVar71 = vmaxss_avx512f(auVar71,auVar68);
              auVar68 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
              auVar68 = vsubss_avx512f(auVar68,in_ZMM24._0_16_);
              auVar68 = vaddss_avx512f(auVar68,in_ZMM23._0_16_);
              auVar68 = vmaxss_avx(auVar68,ZEXT416(0) << 0x40);
              fVar78 = fVar73 * (((auVar72._0_4_ + auVar9._0_4_) - auVar71._0_4_) - auVar68._0_4_);
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),
                                        ZEXT416((uint)fVar82),ZEXT416((uint)fVar10));
              *pfVar41 = auVar72._0_4_;
              *pbVar27 = 0.0 <= fVar82 + fVar10;
              iVar59 = iVar59 + iVar2;
              lVar46 = lVar46 + lVar44;
              pfVar41 = pfVar41 + 1;
              pbVar27 = pbVar27 + 1;
              iVar67 = iVar67 + 1;
              uVar45 = uVar45 + iVar2;
              iVar37 = iVar37 + iVar2;
              iVar51 = iVar51 + iVar2;
              iVar35 = iVar35 + iVar2;
              iVar55 = iVar55 + iVar2;
            } while (lVar46 < iVar52);
          }
          if (iVar29 < iVar28) {
            iVar57 = iVar56 - uVar53;
            iVar60 = iimage->height;
            iVar66 = iVar57;
            if (iVar60 < iVar57) {
              iVar66 = iVar60;
            }
            iVar30 = iVar57 + iVar1;
            if (iVar60 <= iVar57 + iVar1) {
              iVar30 = iVar60;
            }
            iVar39 = (iVar66 + -1) * iVar3;
            iVar20 = iVar56 - uVar12;
            iVar17 = (iVar30 + -1) * iVar3;
            iVar57 = iVar20;
            if (iVar60 < iVar20) {
              iVar57 = iVar60;
            }
            iVar32 = iVar20 + uVar11;
            if (iVar60 <= (int)(iVar20 + uVar11)) {
              iVar32 = iVar60;
            }
            iVar54 = (iVar57 + -1) * iVar3;
            iVar31 = (iVar32 + -1) * iVar3;
            iVar33 = uVar11 + 1 + iVar56;
            iVar20 = iVar56 - uVar11;
            if (iVar60 < (int)(iVar56 - uVar11)) {
              iVar20 = iVar60;
            }
            iVar21 = iVar60;
            if (iVar56 < iVar60) {
              iVar21 = iVar56;
            }
            iVar34 = (iVar20 + -1) * iVar3;
            iVar35 = (iVar21 + -1) * iVar3;
            iVar50 = iVar56 + 1;
            if (iVar60 < iVar56 + 1) {
              iVar50 = iVar60;
            }
            if (iVar33 < iVar60) {
              iVar60 = iVar33;
            }
            iVar33 = (iVar50 + -1) * iVar3;
            iVar55 = (iVar60 + -1) * iVar3;
            lVar65 = (long)iVar67;
            lVar46 = (long)iVar29;
            iVar67 = (iVar52 + iVar2) - iVar42;
            do {
              fVar78 = 0.0;
              iVar51 = iVar16 + iVar67;
              if (iVar5 < iVar16 + iVar67) {
                iVar51 = iVar5;
              }
              iVar38 = iVar51 + -1;
              iVar59 = iVar61 + iVar67;
              if (iVar5 <= iVar61 + iVar67) {
                iVar59 = iVar5;
              }
              auVar72 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[(long)((iVar61 + iVar56) * iVar3 +
                                                                    iVar5) + -1] -
                                                      pfVar8[iVar62 + -2 + iVar67])),
                                        ZEXT416((uint)(pfVar8[(long)((iVar61 + iVar56) * iVar3 +
                                                                    iVar5) + -1] -
                                                      pfVar8[iVar48 + -2 + iVar67])),auVar74);
              fVar75 = 0.0;
              if ((0 < iVar66) && (0 < iVar51)) {
                fVar78 = pfVar8[iVar39 + iVar38];
              }
              iVar36 = iVar59 + -1;
              if ((0 < iVar66) && (0 < iVar59)) {
                fVar75 = pfVar8[iVar39 + iVar36];
              }
              fVar77 = 0.0;
              fVar79 = 0.0;
              if ((0 < iVar30) && (0 < iVar51)) {
                fVar79 = pfVar8[iVar17 + iVar38];
              }
              if ((0 < iVar30) && (0 < iVar59)) {
                fVar77 = pfVar8[iVar17 + iVar36];
              }
              fVar80 = 0.0;
              if ((0 < iVar57) && (0 < iVar51)) {
                fVar80 = pfVar8[iVar54 + iVar38];
              }
              fVar81 = 0.0;
              if ((0 < iVar57) && (0 < iVar59)) {
                fVar81 = pfVar8[iVar54 + iVar36];
              }
              fVar82 = 0.0;
              fVar83 = 0.0;
              if ((0 < iVar32) && (0 < iVar51)) {
                fVar83 = pfVar8[iVar38 + iVar31];
              }
              if ((0 < iVar32) && (0 < iVar59)) {
                fVar82 = pfVar8[iVar36 + iVar31];
              }
              fVar76 = 0.0;
              iVar51 = iVar67;
              if (iVar5 < iVar67) {
                iVar51 = iVar5;
              }
              iVar59 = uVar11 + iVar67;
              if (iVar5 <= (int)(uVar11 + iVar67)) {
                iVar59 = iVar5;
              }
              iVar38 = iVar51 + -1;
              auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),
                                  ZEXT816(0) << 0x40);
              auVar68 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                                   ZEXT816(0) << 0x40);
              auVar9 = vfmadd132ss_fma(auVar68,auVar9,auVar74);
              fVar78 = 0.0;
              if ((0 < iVar20) && (0 < iVar51)) {
                fVar78 = pfVar8[iVar34 + iVar38];
              }
              iVar36 = iVar59 + -1;
              if ((0 < iVar20) && (0 < iVar59)) {
                fVar76 = pfVar8[iVar34 + iVar36];
              }
              fVar79 = 0.0;
              fVar75 = 0.0;
              if ((0 < iVar21) && (0 < iVar51)) {
                fVar75 = pfVar8[iVar35 + iVar38];
              }
              if ((0 < iVar21) && (0 < iVar59)) {
                fVar79 = pfVar8[iVar35 + iVar36];
              }
              fVar77 = 0.0;
              iVar37 = iVar16 + -1 + iVar67;
              if (iVar5 < iVar37) {
                iVar37 = iVar5;
              }
              iVar23 = iVar67 + -1;
              if (iVar5 <= iVar67 + -1) {
                iVar23 = iVar5;
              }
              iVar24 = iVar37 + -1;
              if ((0 < iVar50) && (0 < iVar37)) {
                fVar77 = pfVar8[iVar33 + iVar24];
              }
              iVar19 = iVar23 + -1;
              fVar80 = 0.0;
              if ((0 < iVar50) && (0 < iVar23)) {
                fVar80 = pfVar8[iVar33 + iVar19];
              }
              fVar83 = 0.0;
              fVar81 = 0.0;
              if ((0 < iVar60) && (0 < iVar37)) {
                fVar81 = pfVar8[iVar55 + iVar24];
              }
              if ((0 < iVar60) && (0 < iVar23)) {
                fVar83 = pfVar8[iVar55 + iVar19];
              }
              auVar68 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              in_ZMM16 = ZEXT1664(auVar68);
              if ((0 < iVar20) && (0 < iVar37)) {
                in_ZMM16 = ZEXT464((uint)pfVar8[iVar34 + iVar24]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
              in_ZMM17 = ZEXT1664(auVar68);
              if ((0 < iVar20) && (0 < iVar23)) {
                in_ZMM17 = ZEXT464((uint)pfVar8[iVar34 + iVar19]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
              in_ZMM18 = ZEXT1664(auVar68);
              auVar68 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
              in_ZMM19 = ZEXT1664(auVar68);
              if ((0 < iVar21) && (0 < iVar37)) {
                in_ZMM19 = ZEXT464((uint)pfVar8[iVar24 + iVar35]);
              }
              if ((0 < iVar21) && (0 < iVar23)) {
                in_ZMM18 = ZEXT464((uint)pfVar8[iVar19 + iVar35]);
              }
              auVar68 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
              in_ZMM20 = ZEXT1664(auVar68);
              auVar71 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              in_ZMM21 = ZEXT1664(auVar71);
              if ((0 < iVar50) && (0 < iVar51)) {
                in_ZMM21 = ZEXT464((uint)pfVar8[iVar33 + iVar38]);
              }
              auVar71 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              in_ZMM22 = ZEXT1664(auVar71);
              if ((0 < iVar50) && (0 < iVar59)) {
                in_ZMM22 = ZEXT464((uint)pfVar8[iVar33 + iVar36]);
              }
              auVar71 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
              in_ZMM23 = ZEXT1664(auVar71);
              auVar71 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
              in_ZMM24 = ZEXT1664(auVar71);
              if ((0 < iVar60) && (0 < iVar51)) {
                in_ZMM24 = ZEXT464((uint)pfVar8[iVar38 + iVar55]);
              }
              if ((0 < iVar60) && (0 < iVar59)) {
                in_ZMM23 = ZEXT464((uint)pfVar8[iVar36 + iVar55]);
              }
              fVar82 = fVar73 * auVar72._0_4_;
              fVar10 = fVar73 * auVar9._0_4_;
              auVar72 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar76) - fVar75))),
                                   ZEXT816(0) << 0x40);
              auVar9 = vmaxss_avx(ZEXT416((uint)(fVar83 + ((fVar77 - fVar80) - fVar81))),
                                  ZEXT816(0) << 0x40);
              auVar71 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
              auVar71 = vsubss_avx512f(auVar71,in_ZMM19._0_16_);
              auVar71 = vaddss_avx512f(auVar71,in_ZMM18._0_16_);
              auVar71 = vmaxss_avx512f(auVar71,auVar68);
              auVar68 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
              auVar68 = vsubss_avx512f(auVar68,in_ZMM24._0_16_);
              auVar68 = vaddss_avx512f(auVar68,in_ZMM23._0_16_);
              auVar68 = vmaxss_avx(auVar68,ZEXT416(0) << 0x40);
              fVar78 = fVar73 * (((auVar72._0_4_ + auVar9._0_4_) - auVar71._0_4_) - auVar68._0_4_);
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),
                                        ZEXT416((uint)fVar82),ZEXT416((uint)fVar10));
              pfVar6[lVar65] = auVar72._0_4_;
              pbVar7[lVar65] = 0.0 <= fVar82 + fVar10;
              lVar65 = lVar65 + 1;
              lVar46 = lVar46 + lVar44;
              iVar67 = iVar67 + iVar2;
            } while (lVar46 < iVar28);
          }
          auVar72 = in_ZMM20._0_16_;
          iVar40 = iVar40 + iVar13;
          local_130 = local_130 + iVar13;
          local_134 = local_134 + iVar13;
          uVar47 = uVar47 + lVar44;
          iVar62 = iVar62 + iVar13;
          iVar48 = iVar48 + iVar13;
        } while ((long)uVar47 < (long)(ulong)uVar11);
      }
    }
  }
  iVar14 = (uVar11 - 1) + iVar2;
  iVar14 = iVar14 - iVar14 % iVar2;
  iVar22 = iVar22 * iVar2;
  if (iVar14 < iVar22) {
    auVar72 = vxorps_avx512vl(auVar72,auVar72);
    do {
      if (0 < iVar4 * iVar2) {
        iVar15 = iVar14 - uVar11;
        iVar29 = iimage->height;
        iVar62 = iVar15 + uVar11 * 2;
        iVar40 = iVar15 + 1;
        if (iVar29 < iVar15 + 1) {
          iVar40 = iVar29;
        }
        if (iVar29 <= iVar62) {
          iVar62 = iVar29;
        }
        iVar28 = (iVar40 + -1) * iVar3;
        iVar48 = (iVar62 + -1) * iVar3;
        iVar13 = iVar14 - uVar53;
        iVar16 = iVar13;
        if (iVar29 < iVar13) {
          iVar16 = iVar29;
        }
        iVar42 = iVar13 + iVar1;
        if (iVar29 <= iVar13 + iVar1) {
          iVar42 = iVar29;
        }
        iVar61 = (iVar16 + -1) * iVar3;
        iVar52 = (iVar42 + -1) * iVar3;
        iVar56 = iVar14 - uVar12;
        iVar13 = iVar56;
        if (iVar29 < iVar56) {
          iVar13 = iVar29;
        }
        iVar67 = iVar56 + uVar11;
        if (iVar29 <= (int)(iVar56 + uVar11)) {
          iVar67 = iVar29;
        }
        iVar60 = (iVar13 + -1) * iVar3;
        iVar56 = (iVar67 + -1) * iVar3;
        if (iVar29 < iVar15) {
          iVar15 = iVar29;
        }
        iVar66 = iVar29;
        if (iVar14 < iVar29) {
          iVar66 = iVar14;
        }
        iVar17 = (iVar15 + -1) * iVar3;
        iVar30 = (iVar66 + -1) * iVar3;
        iVar39 = iVar14 + 1 + uVar11;
        iVar57 = iVar14 + 1;
        if (iVar29 < iVar14 + 1) {
          iVar57 = iVar29;
        }
        if (iVar39 < iVar29) {
          iVar29 = iVar39;
        }
        lVar44 = (long)((iVar14 / iVar2) * iVar4);
        iVar32 = 0;
        iVar39 = (iVar57 + -1) * iVar3;
        iVar20 = (iVar29 + -1) * iVar3;
        do {
          fVar75 = 0.0;
          fVar78 = 0.0;
          iVar33 = iVar32 - uVar53;
          if (iVar5 < (int)(iVar32 - uVar53)) {
            iVar33 = iVar5;
          }
          iVar31 = (iVar1 - uVar53) + iVar32;
          if (iVar5 <= iVar31) {
            iVar31 = iVar5;
          }
          if ((0 < iVar40) && (0 < iVar33)) {
            fVar78 = pfVar8[iVar28 + iVar33 + -1];
          }
          if ((0 < iVar40) && (0 < iVar31)) {
            fVar75 = pfVar8[iVar28 + iVar31 + -1];
          }
          fVar77 = 0.0;
          fVar79 = 0.0;
          if ((0 < iVar62) && (0 < iVar33)) {
            fVar79 = pfVar8[iVar33 + -1 + iVar48];
          }
          if ((0 < iVar62) && (0 < iVar31)) {
            fVar77 = pfVar8[iVar31 + -1 + iVar48];
          }
          auVar74 = ZEXT816(0) << 0x40;
          fVar80 = 0.0;
          iVar33 = iVar32 - uVar12;
          if (iVar5 < (int)(iVar32 - uVar12)) {
            iVar33 = iVar5;
          }
          iVar31 = (uVar11 - uVar12) + iVar32;
          if (iVar5 <= iVar31) {
            iVar31 = iVar5;
          }
          if ((0 < iVar40) && (0 < iVar33)) {
            fVar80 = pfVar8[iVar28 + iVar33 + -1];
          }
          fVar81 = 0.0;
          if ((0 < iVar40) && (0 < iVar31)) {
            fVar81 = pfVar8[iVar28 + iVar31 + -1];
          }
          fVar82 = 0.0;
          fVar83 = 0.0;
          if ((0 < iVar62) && (0 < iVar33)) {
            fVar83 = pfVar8[iVar33 + -1 + iVar48];
          }
          if ((0 < iVar62) && (0 < iVar31)) {
            fVar82 = pfVar8[iVar31 + -1 + iVar48];
          }
          iVar33 = -uVar11 + 1 + iVar32;
          fVar76 = 0.0;
          if (iVar5 < iVar33) {
            iVar33 = iVar5;
          }
          iVar31 = uVar11 + iVar32;
          if (iVar5 <= (int)(uVar11 + iVar32)) {
            iVar31 = iVar5;
          }
          iVar54 = iVar33 + -1;
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar75) - fVar79) + fVar77)),auVar74);
          auVar68 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar80 - fVar81) - fVar83))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar68,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar78 = 0.0;
          if ((0 < iVar16) && (0 < iVar33)) {
            fVar78 = pfVar8[iVar61 + iVar54];
          }
          iVar21 = iVar31 + -1;
          if ((0 < iVar16) && (0 < iVar31)) {
            fVar76 = pfVar8[iVar61 + iVar21];
          }
          fVar79 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar42) && (0 < iVar33)) {
            fVar75 = pfVar8[iVar52 + iVar54];
          }
          if ((0 < iVar42) && (0 < iVar31)) {
            fVar79 = pfVar8[iVar52 + iVar21];
          }
          if ((0 < iVar13) && (0 < iVar33)) {
            auVar74 = ZEXT416((uint)pfVar8[iVar60 + iVar54]);
          }
          fVar77 = 0.0;
          if ((0 < iVar13) && (0 < iVar31)) {
            fVar77 = pfVar8[iVar60 + iVar21];
          }
          fVar81 = 0.0;
          fVar80 = 0.0;
          if ((0 < iVar67) && (0 < iVar33)) {
            fVar80 = pfVar8[iVar54 + iVar56];
          }
          if ((0 < iVar67) && (0 < iVar31)) {
            fVar81 = pfVar8[iVar21 + iVar56];
          }
          iVar31 = iVar32 + 1 + uVar11;
          fVar83 = 0.0;
          iVar33 = iVar32 + 1;
          if (iVar5 < iVar32 + 1) {
            iVar33 = iVar5;
          }
          if (iVar5 <= iVar31) {
            iVar31 = iVar5;
          }
          iVar54 = iVar33 + -1;
          auVar68 = vmaxss_avx(ZEXT416((uint)(((fVar78 - fVar76) - fVar75) + fVar79)),
                               ZEXT816(0) << 0x40);
          auVar74 = vmaxss_avx(ZEXT416((uint)(fVar81 + ((auVar74._0_4_ - fVar77) - fVar80))),
                               ZEXT816(0) << 0x40);
          auVar74 = vfmadd132ss_fma(auVar74,auVar68,SUB6416(ZEXT464(0xc0400000),0));
          fVar78 = 0.0;
          if ((0 < iVar15) && (0 < iVar33)) {
            fVar78 = pfVar8[iVar17 + iVar54];
          }
          iVar21 = iVar31 + -1;
          if ((0 < iVar15) && (0 < iVar31)) {
            fVar83 = pfVar8[iVar17 + iVar21];
          }
          fVar79 = 0.0;
          fVar75 = 0.0;
          if ((0 < iVar66) && (0 < iVar33)) {
            fVar75 = pfVar8[iVar30 + iVar54];
          }
          if ((0 < iVar66) && (0 < iVar31)) {
            fVar79 = pfVar8[iVar30 + iVar21];
          }
          iVar50 = -uVar11 + iVar32;
          fVar77 = 0.0;
          if (iVar5 < iVar50) {
            iVar50 = iVar5;
          }
          iVar35 = iVar5;
          if (iVar32 < iVar5) {
            iVar35 = iVar32;
          }
          iVar34 = iVar50 + -1;
          if ((0 < iVar57) && (0 < iVar50)) {
            fVar77 = pfVar8[iVar39 + iVar34];
          }
          iVar55 = iVar35 + -1;
          fVar80 = 0.0;
          if ((0 < iVar57) && (0 < iVar35)) {
            fVar80 = pfVar8[iVar39 + iVar55];
          }
          fVar82 = 0.0;
          fVar81 = 0.0;
          if ((0 < iVar29) && (0 < iVar50)) {
            fVar81 = pfVar8[iVar20 + iVar34];
          }
          if ((0 < iVar29) && (0 < iVar35)) {
            fVar82 = pfVar8[iVar20 + iVar55];
          }
          auVar68 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar68);
          if ((0 < iVar15) && (0 < iVar50)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar17 + iVar34]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar68);
          if ((0 < iVar15) && (0 < iVar35)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar17 + iVar55]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar68);
          if ((0 < iVar66) && (0 < iVar50)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar34 + iVar30]);
          }
          if ((0 < iVar66) && (0 < iVar35)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar55 + iVar30]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar68);
          if ((0 < iVar57) && (0 < iVar33)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar39 + iVar54]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar68);
          if ((0 < iVar57) && (0 < iVar31)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar39 + iVar21]);
          }
          auVar68 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar68);
          auVar68 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar68);
          if ((0 < iVar29) && (0 < iVar33)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar54 + iVar20]);
          }
          if ((0 < iVar29) && (0 < iVar31)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar21 + iVar20]);
          }
          fVar76 = fVar73 * auVar9._0_4_;
          fVar10 = fVar73 * auVar74._0_4_;
          auVar74 = vmaxss_avx(ZEXT416((uint)(fVar79 + ((fVar78 - fVar83) - fVar75))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar82 + ((fVar77 - fVar80) - fVar81))),
                              ZEXT816(0) << 0x40);
          auVar68 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar68 = vsubss_avx512f(auVar68,in_ZMM19._0_16_);
          auVar68 = vaddss_avx512f(auVar68,in_ZMM18._0_16_);
          auVar71 = vmaxss_avx512f(auVar68,auVar72);
          auVar68 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar68 = vsubss_avx512f(auVar68,in_ZMM24._0_16_);
          auVar68 = vaddss_avx512f(auVar68,in_ZMM23._0_16_);
          auVar68 = vmaxss_avx(auVar68,ZEXT816(0) << 0x40);
          fVar78 = fVar73 * (((auVar74._0_4_ + auVar9._0_4_) - auVar71._0_4_) - auVar68._0_4_);
          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * fVar78 * -0.81)),ZEXT416((uint)fVar76),
                                    ZEXT416((uint)fVar10));
          pfVar6[lVar44] = auVar74._0_4_;
          pbVar7[lVar44] = 0.0 <= fVar76 + fVar10;
          lVar44 = lVar44 + 1;
          iVar32 = iVar32 + iVar2;
        } while (iVar32 < iVar4 * iVar2);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 < iVar22);
  }
  return;
}

Assistant:

void compute_response_layer_Dxx_top(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_Dxx_leftcorner

        optimization:
        - Dxx box filter hand optimized and split into cases (here only top)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dxx0, Dxx1;
    float A, B, C, D;
    int k, k0;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    k = (lobe / 2 + 1 + step - 1) / step * step;

    // Top Left Corner
    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width;

        // Case 1: C of neg part outside
        for (int j = 0; j < lobe / 2 + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            D = data[r11 * data_width + c11];
            Dxx1 = D;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: B of neg part inside
        // initial value has to be rounded up to next bigger step
        for (int j = k; j < border + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid
    k = (border + 1 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step - border; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;
            c01 = y + border;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) -
                  box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right
    k = (width * step - border + step - 1) / step * step;
    k0 = (width * step - lobe / 2 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        // Case 1: D of neg part inside
        for (int j = k; j < width * step - lobe / 2; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: D of neg part outside
        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}